

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O3

matrix2f * __thiscall tinyusdz::value::matrix2f::operator=(matrix2f *this,matrix2d *src)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = src->m[0][1];
  dVar2 = src->m[1][0];
  dVar3 = src->m[1][1];
  this->m[0][0] = (float)src->m[0][0];
  this->m[0][1] = (float)dVar1;
  this->m[1][0] = (float)dVar2;
  this->m[1][1] = (float)dVar3;
  return this;
}

Assistant:

matrix2f &matrix2f::operator=(const matrix2d &src) {

  for (size_t j = 0; j < 2; j++) {
    for (size_t i = 0; i < 2; i++) {
      m[j][i] = float(src.m[j][i]);
    }
  }

  return *this;
}